

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O1

iterator __thiscall
QHash<QWidget_const*,QStyleSheetStyleCaches::Tampered<QPalette>>::
emplace_helper<QStyleSheetStyleCaches::Tampered<QPalette>>
          (QHash<QWidget_const*,QStyleSheetStyleCaches::Tampered<QPalette>> *this,QWidget **key,
          Tampered<QPalette> *args)

{
  QPalettePrivate *pQVar1;
  piter pVar2;
  Entry *pEVar3;
  long in_FS_OFFSET;
  undefined1 local_58 [32];
  QPalette local_38;
  ResolveMask local_28;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  local_58._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_58._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_58._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  QHashPrivate::Data<QHashPrivate::Node<QWidget_const*,QStyleSheetStyleCaches::Tampered<QPalette>>>
  ::findOrInsert<QWidget_const*>
            ((InsertionResult *)local_58,
             *(Data<QHashPrivate::Node<QWidget_const*,QStyleSheetStyleCaches::Tampered<QPalette>>>
               **)this,key);
  pEVar3 = (*(Span **)(local_58._0_8_ + 0x20))[(ulong)local_58._8_8_ >> 7].entries +
           (*(Span **)(local_58._0_8_ + 0x20))[(ulong)local_58._8_8_ >> 7].offsets
           [(uint)local_58._8_8_ & 0x7f];
  if (local_58[0x10] == false) {
    *(QWidget **)(pEVar3->storage).data = *key;
    pQVar1 = (args->oldWidgetValue).d;
    (args->oldWidgetValue).d = (QPalettePrivate *)0x0;
    *(QPalettePrivate **)((pEVar3->storage).data + 8) = pQVar1;
    *(ColorGroup *)((pEVar3->storage).data + 0x10) = (args->oldWidgetValue).currentGroup;
    *(ResolveMask *)((pEVar3->storage).data + 0x18) = args->resolveMask;
  }
  else {
    pQVar1 = (args->oldWidgetValue).d;
    (args->oldWidgetValue).d = (QPalettePrivate *)0x0;
    local_28 = args->resolveMask;
    local_38.currentGroup = *(ColorGroup *)((pEVar3->storage).data + 0x10);
    *(ColorGroup *)((pEVar3->storage).data + 0x10) = (args->oldWidgetValue).currentGroup;
    local_38.d = *(QPalettePrivate **)((pEVar3->storage).data + 8);
    *(QPalettePrivate **)((pEVar3->storage).data + 8) = pQVar1;
    *(ResolveMask *)((pEVar3->storage).data + 0x18) = local_28;
    QPalette::~QPalette(&local_38);
  }
  pVar2.bucket = local_58._8_8_;
  pVar2.d = (Data<QHashPrivate::Node<const_QWidget_*,_QStyleSheetStyleCaches::Tampered<QPalette>_>_>
             *)local_58._0_8_;
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return (iterator)pVar2;
  }
  __stack_chk_fail();
}

Assistant:

iterator emplace_helper(Key &&key, Args &&... args)
    {
        auto result = d->findOrInsert(key);
        if (!result.initialized)
            Node::createInPlace(result.it.node(), std::move(key), std::forward<Args>(args)...);
        else
            result.it.node()->emplaceValue(std::forward<Args>(args)...);
        return iterator(result.it);
    }